

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateInitializers
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var3;
  Descriptor *pDVar4;
  LogMessage *other;
  long *plVar5;
  long lVar6;
  long lVar7;
  LogFinisher local_79;
  ImmutableMessageLiteGenerator *local_78;
  Printer *local_70;
  LogMessage local_68;
  
  pDVar4 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar4 + 4)) {
    lVar7 = 0;
    lVar6 = 0;
    local_78 = this;
    local_70 = printer;
    do {
      lVar1 = *(long *)(pDVar4 + 0x28);
      if ((((*(byte *)(lVar1 + 1 + lVar7) & 0x10) == 0) ||
          (lVar2 = *(long *)(lVar1 + 0x28 + lVar7), lVar2 == 0)) ||
         ((*(int *)(lVar2 + 4) == 1 && ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) != 0)))) {
        if (*(Descriptor **)(lVar1 + 0x20 + lVar7) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (field->containing_type()) == (descriptor_): "
                            );
          internal::LogFinisher::operator=(&local_79,other);
          internal::LogMessage::~LogMessage(&local_68);
          this = local_78;
        }
        if ((*(byte *)(lVar1 + 1 + lVar7) & 8) == 0) {
          plVar5 = (long *)(*(long *)(lVar1 + 0x20 + lVar7) + 0x28);
        }
        else {
          lVar2 = *(long *)(lVar1 + 0x28 + lVar7);
          if (lVar2 == 0) {
            plVar5 = (long *)(*(long *)(lVar1 + 0x10 + lVar7) + 0x70);
          }
          else {
            plVar5 = (long *)(lVar2 + 0x50);
          }
        }
        _Var3._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
        .
        super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
        ._M_head_impl =
             (this->field_generators_).field_generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(int)((ulong)((lVar1 - *plVar5) + lVar7) >> 3) * 0x38e38e39]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
             ._M_t;
        (**(code **)(*(long *)_Var3._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                              ._M_head_impl + 0x30))
                  (_Var3._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                   ._M_head_impl,local_70);
      }
      lVar6 = lVar6 + 1;
      pDVar4 = (this->super_MessageGenerator).descriptor_;
      lVar7 = lVar7 + 0x48;
    } while (lVar6 < *(int *)(pDVar4 + 4));
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!IsRealOneof(descriptor_->field(i))) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}